

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  ostream *poVar2;
  long *plVar3;
  int iVar4;
  uint8_t value;
  ofstream outFile;
  uint auStack_420 [122];
  ifstream inFile;
  
  std::ifstream::ifstream(&inFile,argv[1],_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    iVar4 = 1;
  }
  else {
    std::ofstream::ofstream(&outFile,argv[2],_S_out);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      iVar4 = 1;
    }
    else {
      *(uint *)((long)auStack_420 + *(long *)(_outFile + -0x18)) =
           *(uint *)((long)auStack_420 + *(long *)(_outFile + -0x18)) & 0xffffffb5 | 8;
      std::operator<<((ostream *)&outFile,"#include <vector>\n\n");
      poVar2 = std::operator<<((ostream *)&outFile,"const std::vector<std::uint8_t> ");
      poVar2 = std::operator<<(poVar2,argv[3]);
      std::operator<<(poVar2," = {");
      iVar4 = 0;
      while( true ) {
        plVar3 = (long *)std::istream::get((char *)&inFile);
        if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) break;
        if (iVar4 == 0) {
          std::operator<<((ostream *)&outFile,"\n\t");
        }
        poVar2 = std::operator<<((ostream *)&outFile,"0x");
        *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 2;
        poVar2 = std::operator<<(poVar2,0x30);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::operator<<(poVar2,",");
        iVar4 = (iVar4 + 1) % 0x20;
      }
      std::operator<<((ostream *)&outFile,"\n};\n");
      iVar4 = 0;
    }
    std::ofstream::~ofstream(&outFile);
  }
  std::ifstream::~ifstream(&inFile);
  return iVar4;
}

Assistant:

int main(int argc, char* argv[])
{
	const int rowLength = 32;

	std::ifstream inFile(argv[1], std::ios::binary);
	if (!inFile.is_open()) return EXIT_FAILURE;

	std::ofstream outFile(argv[2]);
	if (!outFile.is_open()) return EXIT_FAILURE;

	outFile << std::hex;
	outFile << "#include <vector>\n\n";
	outFile << "const std::vector<std::uint8_t> " << argv[3] << " = {";

	std::uint8_t value = 0;
	int rowCount = 0;

	while (inFile.get(reinterpret_cast<char&>(value)))
	{
		if (rowCount++ == 0)
		{
			outFile << "\n\t";
		}

		outFile << "0x" << std::setw(2) << std::setfill('0') << static_cast<std::uint32_t>(value) << ",";

		rowCount %= rowLength;
	}

	outFile << "\n};\n";

	return EXIT_SUCCESS;
}